

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resultvalue.cpp
# Opt level: O2

ostream * operator<<(ostream *os,ResultValueType value)

{
  if (value < 4) {
    std::operator<<(os,&DAT_0013e8a0 + *(int *)(&DAT_0013e8a0 + (ulong)value * 4));
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, ResultValueType value) {
	switch (value) {
	case ResultValueType::NONE:
		os << "NONE";
		break;
	case ResultValueType::INTEGER:
		os << "INTEGER";
		break;
	case ResultValueType::FLOAT:
		os << "FLOAT";
		break;
	case ResultValueType::COMPLEX:
		os << "COMPLEX";
		break;
	}
	return os;
}